

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O3

int __thiscall Peers::remove(Peers *this,char *__filename)

{
  uint16_t uVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  iterator __position;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  mapped_type *this_00;
  vector<int,_std::allocator<int>_> *pvVar4;
  int port;
  vector<int,_std::allocator<int>_> ipPeers;
  string peerIp;
  uint local_5c;
  vector<int,_std::allocator<int>_> local_58;
  string local_40;
  
  Peer::name_abi_cxx11_(&local_40,(Peer *)__filename);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
                       *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  Peer::ip_abi_cxx11_(&local_40,(Peer *)__filename);
  uVar1 = Peer::port((Peer *)__filename);
  local_5c = (uint)uVar1;
  if ((_Rb_tree_header *)__position._M_node != &(this->m_peers)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
                    *)this,(const_iterator)__position._M_node);
    this->m_count = this->m_count + -1;
  }
  ip2Peers(&local_58,this,&local_40);
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(_Iter_equals_val<const_int>)&local_5c);
  if (_Var3._M_current !=
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)_Var3;
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_ip2PeerMap,&local_40);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator=(this_00,&local_58);
  iVar2 = (int)pvVar4;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar2 = extraout_EAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void Peers::remove(Peer *peer)
{
    std::map<std::string, std::unique_ptr<Peer>>::iterator pos = m_peers.find(peer->name());
    std::string peerIp = peer->ip();
    int port = peer->port();
    if (pos != m_peers.end()) {
        m_peers.erase(pos);
        --m_count;
    }
    std::vector<int> ipPeers = ip2Peers(peerIp);
    ipPeers.erase(std::remove(ipPeers.begin(), ipPeers.end(), port), ipPeers.end());
    m_ip2PeerMap[peerIp] = ipPeers;
}